

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree.cxx
# Opt level: O2

void __thiscall Fl_Tree::select_toggle(Fl_Tree *this,Fl_Tree_Item *item,int docallback)

{
  uint *puVar1;
  char cVar2;
  
  cVar2 = item->_selected;
  item->_selected = cVar2 == '\0';
  puVar1 = &(this->super_Fl_Group).super_Fl_Widget.flags_;
  *(byte *)puVar1 = (byte)*puVar1 | 0x80;
  if (docallback != 0) {
    do_callback_for_item(this,item,FL_TREE_REASON_DESELECTED - (cVar2 == '\0'));
  }
  Fl_Widget::redraw((Fl_Widget *)this);
  return;
}

Assistant:

void Fl_Tree::select_toggle(Fl_Tree_Item *item, int docallback) {
  item->select_toggle();
  set_changed();
  if ( docallback ) {
    do_callback_for_item(item, item->is_selected() ? FL_TREE_REASON_SELECTED
						   : FL_TREE_REASON_DESELECTED);
  }
  redraw();
}